

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

quat quat_create(float x,float y,float z,float w)

{
  quat qVar1;
  
  qVar1.y = y;
  qVar1.x = x;
  qVar1.w = w;
  qVar1.z = z;
  return qVar1;
}

Assistant:

quat quat_create(float x, float y, float z, float w) {
    quat q;
    q.x = x;
    q.y = y;
    q.z = z;
    q.w = w;
    return q;
}